

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

optional<float> __thiscall pbrt::PiecewiseConstant1D::Invert(PiecewiseConstant1D *this,Float x)

{
  Float a;
  float fVar1;
  int val;
  int iVar2;
  size_t sVar3;
  const_reference pvVar4;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  optional<float> in_RDI;
  float in_XMM0_Da;
  float fVar5;
  undefined1 auVar6 [16];
  Float delta;
  int offset;
  Float c;
  float *in_stack_ffffffffffffffa8;
  
  if ((in_XMM0_Da < *(float *)&in_RSI[2].alloc.memoryResource) ||
     (*(float *)((long)&in_RSI[2].alloc.memoryResource + 4) < in_XMM0_Da)) {
    memset((void *)in_RDI,0,8);
    pstd::optional<float>::optional((optional<float> *)in_RDI);
  }
  else {
    fVar5 = *(float *)((long)&in_RSI[2].alloc.memoryResource + 4) -
            *(float *)&in_RSI[2].alloc.memoryResource;
    auVar6 = ZEXT416((uint)fVar5);
    fVar5 = (in_XMM0_Da - *(float *)&in_RSI[2].alloc.memoryResource) / fVar5;
    sVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RSI);
    auVar6 = vcvtusi2ss_avx512f(auVar6,sVar3);
    fVar1 = fVar5 * auVar6._0_4_;
    val = (int)fVar1;
    sVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RSI);
    iVar2 = Clamp<int,int,unsigned_long>(val,0,sVar3 - 1);
    pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (in_RSI + 1,(long)iVar2);
    a = *pvVar4;
    pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (in_RSI + 1,(long)(iVar2 + 1));
    Lerp(fVar1 - (float)iVar2,a,*pvVar4);
    pstd::optional<float>::optional
              ((optional<float> *)CONCAT44(val,fVar5),in_stack_ffffffffffffffa8);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<Float> Invert(Float x) const {
        // Compute offset to CDF values that bracket $x$
        if (x < min || x > max)
            return {};
        Float c = (x - min) / (max - min) * func.size();
        int offset = Clamp(int(c), 0, func.size() - 1);
        DCHECK(offset >= 0 && offset + 1 < cdf.size());

        // Linearly interpolate between adjacent CDF values to find sample value
        Float delta = c - offset;
        return Lerp(delta, cdf[offset], cdf[offset + 1]);
    }